

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O3

void __thiscall Sock::Close(Sock *this)

{
  string_view source_file;
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  int in_stack_fffffffffffffeec;
  long *local_f0 [2];
  long local_e0 [14];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_socket != 0xffffffff) {
    iVar2 = close(this->m_socket);
    if (iVar2 != 0) {
      __errno_location();
      SysErrorString_abi_cxx11_(in_stack_fffffffffffffeec);
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar3);
      if (bVar1) {
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        tinyformat::format<unsigned_int,std::__cxx11::string>
                  (&local_70,(tinyformat *)"Error closing socket %d: %s\n",(char *)&this->m_socket,
                   (uint *)local_f0,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pLVar3 = LogInstance();
        local_70._M_dataplus._M_p = (pointer)0x56;
        local_70._M_string_length = 0x8a7ad1;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp"
        ;
        source_file._M_len = 0x56;
        str._M_str = local_50._M_dataplus._M_p;
        str._M_len = local_50._M_string_length;
        logging_function._M_str = "Close";
        logging_function._M_len = 5;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x19c,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
    }
    this->m_socket = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Sock::Close()
{
    if (m_socket == INVALID_SOCKET) {
        return;
    }
#ifdef WIN32
    int ret = closesocket(m_socket);
#else
    int ret = close(m_socket);
#endif
    if (ret) {
        LogPrintf("Error closing socket %d: %s\n", m_socket, NetworkErrorString(WSAGetLastError()));
    }
    m_socket = INVALID_SOCKET;
}